

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

wchar_t sftp_cmd_close(sftp_command *cmd)

{
  _Bool _Var1;
  char ch;
  
  if (backend == (Backend *)0x0) {
    not_connected();
  }
  else {
    _Var1 = (*backend->vt->connected)(backend);
    if (_Var1) {
      (*backend->vt->special)(backend,SS_EOF,0);
      sent_eof = 1;
      sftp_recvdata(&ch,1);
    }
    do_sftp_cleanup();
  }
  return L'\0';
}

Assistant:

int sftp_cmd_close(struct sftp_command *cmd)
{
    if (!backend) {
        not_connected();
        return 0;
    }

    if (backend_connected(backend)) {
        char ch;
        backend_special(backend, SS_EOF, 0);
        sent_eof = true;
        sftp_recvdata(&ch, 1);
    }
    do_sftp_cleanup();

    return 0;
}